

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::DeferCall(cmMakefile *this,string *id,string *file,cmListFileFunction *lff)

{
  DeferCommands *this_00;
  undefined1 auStack_78 [64];
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  this_00 = (this->Defer)._M_t.
            super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
            .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (this_00 != (DeferCommands *)0x0) {
    std::__cxx11::string::string((string *)auStack_78,(string *)id);
    std::__cxx11::string::string((string *)(auStack_78 + 0x20),(string *)file);
    local_38 = (lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    _Stack_30._M_pi =
         (lff->Impl).
         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (lff->Impl).
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (lff->Impl).
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
    emplace_back<cmMakefile::DeferCommand>(&this_00->Commands,(DeferCommand *)auStack_78);
    DeferCommand::~DeferCommand((DeferCommand *)auStack_78);
  }
  return this_00 != (DeferCommands *)0x0;
}

Assistant:

bool cmMakefile::CheckCMP0037(std::string const& targetName,
                              cmStateEnums::TargetType targetType) const
{
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (this->GetPolicyStatus(cmPolicies::CMP0037)) {
    case cmPolicies::WARN:
      if (targetType != cmStateEnums::INTERFACE_LIBRARY) {
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName
      << "\" is reserved or not valid for certain "
         "CMake features, such as generator expressions, and may result "
         "in undefined behavior.";
    this->IssueMessage(messageType, e.str());

    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}